

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateElementContent
              (xmlValidCtxtPtr ctxt,xmlNodePtr child,xmlElementPtr elemDecl,int warn,
              xmlNodePtr parent)

{
  xmlElementType xVar1;
  xmlElementContentPtr content;
  xmlNs *pxVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlRegExecCtxtPtr exec;
  xmlChar *pxVar7;
  long lVar8;
  size_t sVar9;
  undefined4 in_register_0000000c;
  xmlChar *str1;
  xmlChar *str2;
  char *msg;
  xmlNodePtr node;
  int local_2770;
  char list [5000];
  xmlChar fn [50];
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return -1;
  }
  str1 = elemDecl->name;
  content = elemDecl->content;
  local_2770 = 1;
  if (elemDecl->contModel == (xmlRegexpPtr)0x0) {
    local_2770 = xmlValidBuildContentModel(ctxt,elemDecl);
  }
  if (elemDecl->contModel == (xmlRegexpPtr)0x0) {
    return -1;
  }
  iVar4 = xmlRegexpIsDeterminist(elemDecl->contModel);
  if (iVar4 != 0) {
    ctxt->nodeNr = 0;
    ctxt->nodeMax = 0;
    ctxt->nodeTab = (xmlNodePtr *)0x0;
    exec = xmlRegNewExecCtxt(elemDecl->contModel,(xmlRegExecCallbacks)0x0,(void *)0x0);
    if (exec != (xmlRegExecCtxtPtr)0x0) {
      if (child != (xmlNodePtr)0x0) {
        node = child;
        do {
          xVar1 = node->type;
          if (xVar1 == XML_ENTITY_REF_NODE) {
            if ((node->children == (_xmlNode *)0x0) || (node->children->children == (_xmlNode *)0x0)
               ) goto LAB_0015a411;
            iVar4 = nodeVPush(ctxt,node);
            if (iVar4 < 0) {
              iVar5 = -1;
              goto LAB_0015a4b9;
            }
            node = node->children->children;
          }
          else {
            if (xVar1 == XML_ELEMENT_NODE) {
              pxVar2 = node->ns;
              if ((pxVar2 == (xmlNs *)0x0) || (pxVar2->prefix == (xmlChar *)0x0)) {
                local_2770 = xmlRegExecPushString(exec,node->name,(void *)0x0);
              }
              else {
                pxVar7 = xmlBuildQName(node->name,pxVar2->prefix,fn,0x32);
                bVar3 = pxVar7 != (xmlChar *)0x0;
                if (pxVar7 == (xmlChar *)0x0) {
                  xmlVErrMemory(ctxt);
                  local_2770 = -1;
                  iVar4 = 5;
                }
                else {
                  local_2770 = xmlRegExecPushString(exec,pxVar7,(void *)0x0);
                  if ((pxVar7 != fn) && (pxVar7 != node->name)) {
                    (*xmlFree)(pxVar7);
                  }
                  iVar4 = 0;
                }
                if (iVar4 != 0) {
                  iVar5 = local_2770;
                  if (iVar4 == 5) goto LAB_0015a4b9;
                  goto LAB_0015a4ce;
                }
              }
            }
            else {
              iVar5 = 0;
              if (xVar1 == XML_TEXT_NODE) {
                iVar4 = xmlIsBlankNode(node);
                if (iVar4 == 0) goto LAB_0015a4b9;
              }
              else if (xVar1 == XML_CDATA_SECTION_NODE) goto LAB_0015a4b9;
            }
LAB_0015a411:
            if (local_2770 == -5) {
              xmlVErrMemory(ctxt);
            }
            do {
              node = node->next;
              if (node != (_xmlNode *)0x0) goto LAB_0015a320;
              iVar4 = ctxt->nodeNr;
              lVar8 = (long)iVar4;
              if (lVar8 < 1) {
                node = (xmlNodePtr)0x0;
              }
              else {
                ctxt->nodeNr = iVar4 + -1;
                if (iVar4 == 1) {
                  ctxt->node = (xmlNodePtr)0x0;
                }
                else {
                  ctxt->node = ctxt->nodeTab[lVar8 + -2];
                }
                node = ctxt->nodeTab[lVar8 + -1];
                ctxt->nodeTab[lVar8 + -1] = (xmlNodePtr)0x0;
              }
            } while (node != (xmlNodePtr)0x0);
            node = (_xmlNode *)0x0;
          }
LAB_0015a320:
        } while (node != (_xmlNode *)0x0);
      }
      iVar5 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
      if (iVar5 == -5) {
        xmlVErrMemory(ctxt);
        iVar5 = -5;
      }
LAB_0015a4b9:
      local_2770 = iVar5;
      xmlRegFreeExecCtxt(exec);
      bVar3 = true;
      goto LAB_0015a4ce;
    }
    xmlVErrMemory(ctxt);
  }
  bVar3 = false;
LAB_0015a4ce:
  iVar4 = -1;
  if (bVar3) {
    if ((local_2770 != -3) && (local_2770 != 1)) {
      fn[0] = '\0';
      xmlSnprintfElementContent((char *)fn,5000,content,1);
      list[0] = '\0';
      if (child != (xmlNodePtr)0x0) {
        sVar9 = strlen(list);
        (list + sVar9)[0] = '(';
        (list + sVar9)[1] = '\0';
        do {
          sVar9 = strlen(list);
          iVar4 = (int)sVar9;
          if (0x1356 < iVar4) {
            if ((iVar4 < 0x1384) && (list[iVar4 + -1] != '.')) {
              sVar9 = strlen(list);
              builtin_strncpy(list + sVar9," ...",5);
            }
            goto LAB_0015a6db;
          }
          switch(child->type) {
          case XML_ELEMENT_NODE:
            iVar5 = xmlStrlen(child->name);
            if ((child->ns != (xmlNs *)0x0) &&
               (pxVar7 = child->ns->prefix, pxVar7 != (xmlChar *)0x0)) {
              iVar6 = xmlStrlen(pxVar7);
              iVar5 = iVar5 + iVar6 + 1;
            }
            if (5000 - iVar4 < iVar5 + 10) {
              if (list[iVar4 + -1] != '.') {
                sVar9 = strlen(list);
                builtin_strncpy(list + sVar9," ...",5);
              }
            }
            else {
              if ((child->ns != (xmlNs *)0x0) &&
                 (pxVar7 = child->ns->prefix, pxVar7 != (xmlChar *)0x0)) {
                strcat(list,(char *)pxVar7);
                sVar9 = strlen(list);
                (list + sVar9)[0] = ':';
                (list + sVar9)[1] = '\0';
              }
              if (child->name != (xmlChar *)0x0) {
                strcat(list,(char *)child->name);
              }
              if (child->next != (_xmlNode *)0x0) {
                sVar9 = strlen(list);
                (list + sVar9)[0] = ' ';
                (list + sVar9)[1] = '\0';
              }
            }
            if (5000 - iVar4 < iVar5 + 10) goto LAB_0015a6db;
            break;
          case XML_ATTRIBUTE_NODE:
          case XML_DOCUMENT_NODE:
          case XML_DOCUMENT_TYPE_NODE:
          case XML_DOCUMENT_FRAG_NODE:
          case XML_NOTATION_NODE:
          case XML_HTML_DOCUMENT_NODE:
          case XML_NAMESPACE_DECL:
            sVar9 = strlen(list);
            builtin_strncpy(list + sVar9,"???",4);
            goto LAB_0015a617;
          case XML_TEXT_NODE:
            iVar4 = xmlIsBlankNode(child);
            if (iVar4 == 0) goto switchD_0015a572_caseD_4;
            break;
          case XML_CDATA_SECTION_NODE:
          case XML_ENTITY_REF_NODE:
switchD_0015a572_caseD_4:
            sVar9 = strlen(list);
            builtin_strncpy(list + sVar9,"CDATA",6);
LAB_0015a617:
            if (child->next != (_xmlNode *)0x0) {
              sVar9 = strlen(list);
              (list + sVar9)[0] = ' ';
              (list + sVar9)[1] = '\0';
            }
          }
          child = child->next;
        } while (child != (_xmlNode *)0x0);
        sVar9 = strlen(list);
        (list + sVar9)[0] = ')';
        (list + sVar9)[1] = '\0';
      }
LAB_0015a6db:
      if (str1 == (xmlChar *)0x0) {
        pxVar7 = (xmlChar *)0x0;
        str2 = (xmlChar *)list;
        msg = "Element content does not follow the DTD, expecting %s, got %s\n";
        str1 = fn;
      }
      else {
        pxVar7 = (xmlChar *)list;
        msg = "Element %s content does not follow the DTD, expecting %s, got %s\n";
        str2 = fn;
      }
      xmlDoErrValid(ctxt,(xmlNodePtr)CONCAT44(in_register_0000000c,warn),XML_DTD_CONTENT_MODEL,2,
                    str1,str2,pxVar7,0,msg,str1,str2,pxVar7);
      local_2770 = 0;
    }
    iVar4 = 1;
    if (local_2770 != -3) {
      iVar4 = local_2770;
    }
    ctxt->nodeNr = 0;
    ctxt->nodeMax = 0;
    if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(ctxt->nodeTab);
      ctxt->nodeTab = (xmlNodePtr *)0x0;
    }
  }
  return iVar4;
}

Assistant:

static int
xmlValidateElementContent(xmlValidCtxtPtr ctxt, xmlNodePtr child,
       xmlElementPtr elemDecl, int warn, xmlNodePtr parent) {
    int ret = 1;
#ifndef  LIBXML_REGEXP_ENABLED
    xmlNodePtr repl = NULL, last = NULL, tmp;
#endif
    xmlNodePtr cur;
    xmlElementContentPtr cont;
    const xmlChar *name;

    if ((elemDecl == NULL) || (parent == NULL) || (ctxt == NULL))
	return(-1);
    cont = elemDecl->content;
    name = elemDecl->name;

#ifdef LIBXML_REGEXP_ENABLED
    /* Build the regexp associated to the content model */
    if (elemDecl->contModel == NULL)
	ret = xmlValidBuildContentModel(ctxt, elemDecl);
    if (elemDecl->contModel == NULL) {
	return(-1);
    } else {
	xmlRegExecCtxtPtr exec;

	if (!xmlRegexpIsDeterminist(elemDecl->contModel)) {
	    return(-1);
	}
	ctxt->nodeMax = 0;
	ctxt->nodeNr = 0;
	ctxt->nodeTab = NULL;
	exec = xmlRegNewExecCtxt(elemDecl->contModel, NULL, NULL);
	if (exec == NULL) {
            xmlVErrMemory(ctxt);
            return(-1);
        }
        cur = child;
        while (cur != NULL) {
            switch (cur->type) {
                case XML_ENTITY_REF_NODE:
                    /*
                     * Push the current node to be able to roll back
                     * and process within the entity
                     */
                    if ((cur->children != NULL) &&
                        (cur->children->children != NULL)) {
                        if (nodeVPush(ctxt, cur) < 0) {
                            ret = -1;
                            goto fail;
                        }
                        cur = cur->children->children;
                        continue;
                    }
                    break;
                case XML_TEXT_NODE:
                    if (xmlIsBlankNode(cur))
                        break;
                    ret = 0;
                    goto fail;
                case XML_CDATA_SECTION_NODE:
                    /* TODO */
                    ret = 0;
                    goto fail;
                case XML_ELEMENT_NODE:
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlChar fn[50];
                        xmlChar *fullname;

                        fullname = xmlBuildQName(cur->name,
                                                 cur->ns->prefix, fn, 50);
                        if (fullname == NULL) {
                            xmlVErrMemory(ctxt);
                            ret = -1;
                            goto fail;
                        }
                        ret = xmlRegExecPushString(exec, fullname, NULL);
                        if ((fullname != fn) && (fullname != cur->name))
                            xmlFree(fullname);
                    } else {
                        ret = xmlRegExecPushString(exec, cur->name, NULL);
                    }
                    break;
                default:
                    break;
            }
            if (ret == XML_REGEXP_OUT_OF_MEMORY)
                xmlVErrMemory(ctxt);
            /*
             * Switch to next element
             */
            cur = cur->next;
            while (cur == NULL) {
                cur = nodeVPop(ctxt);
                if (cur == NULL)
                    break;
                cur = cur->next;
            }
        }
        ret = xmlRegExecPushString(exec, NULL, NULL);
        if (ret == XML_REGEXP_OUT_OF_MEMORY)
            xmlVErrMemory(ctxt);
fail:
        xmlRegFreeExecCtxt(exec);
    }
#else  /* LIBXML_REGEXP_ENABLED */
    /*
     * Allocate the stack
     */
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    ctxt->vstateMax = 8;
#else
    ctxt->vstateMax = 1;
#endif
    ctxt->vstateTab = xmlMalloc(ctxt->vstateMax * sizeof(ctxt->vstateTab[0]));
    if (ctxt->vstateTab == NULL) {
	xmlVErrMemory(ctxt);
	return(-1);
    }
    /*
     * The first entry in the stack is reserved to the current state
     */
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    ctxt->nodeTab = NULL;
    ctxt->vstate = &ctxt->vstateTab[0];
    ctxt->vstateNr = 1;
    CONT = cont;
    NODE = child;
    DEPTH = 0;
    OCCURS = 0;
    STATE = 0;
    ret = xmlValidateElementType(ctxt);
    if ((ret == -3) && (warn)) {
	char expr[5000];
	expr[0] = 0;
	xmlSnprintfElementContent(expr, 5000, elemDecl->content, 1);
	xmlErrValidNode(ctxt, (xmlNodePtr) elemDecl,
                XML_DTD_CONTENT_NOT_DETERMINIST,
	        "Content model of %s is not deterministic: %s\n",
	        name, BAD_CAST expr, NULL);
    } else if (ret == -2) {
	/*
	 * An entities reference appeared at this level.
	 * Build a minimal representation of this node content
	 * sufficient to run the validation process on it
	 */
	cur = child;
	while (cur != NULL) {
	    switch (cur->type) {
		case XML_ENTITY_REF_NODE:
		    /*
		     * Push the current node to be able to roll back
		     * and process within the entity
		     */
		    if ((cur->children != NULL) &&
			(cur->children->children != NULL)) {
			if (nodeVPush(ctxt, cur) < 0) {
                            xmlFreeNodeList(repl);
                            ret = -1;
                            goto done;
                        }
			cur = cur->children->children;
			continue;
		    }
		    break;
		case XML_TEXT_NODE:
		    if (xmlIsBlankNode(cur))
			break;
		    /* falls through */
		case XML_CDATA_SECTION_NODE:
		case XML_ELEMENT_NODE:
		    /*
		     * Allocate a new node and minimally fills in
		     * what's required
		     */
		    tmp = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		    if (tmp == NULL) {
			xmlVErrMemory(ctxt);
			xmlFreeNodeList(repl);
			ret = -1;
			goto done;
		    }
		    tmp->type = cur->type;
		    tmp->name = cur->name;
		    tmp->ns = cur->ns;
		    tmp->next = NULL;
		    tmp->content = NULL;
		    if (repl == NULL)
			repl = last = tmp;
		    else {
			last->next = tmp;
			last = tmp;
		    }
		    if (cur->type == XML_CDATA_SECTION_NODE) {
			/*
			 * E59 spaces in CDATA does not match the
			 * nonterminal S
			 */
			tmp->content = xmlStrdup(BAD_CAST "CDATA");
		    }
		    break;
		default:
		    break;
	    }
	    /*
	     * Switch to next element
	     */
	    cur = cur->next;
	    while (cur == NULL) {
		cur = nodeVPop(ctxt);
		if (cur == NULL)
		    break;
		cur = cur->next;
	    }
	}

	/*
	 * Relaunch the validation
	 */
	ctxt->vstate = &ctxt->vstateTab[0];
	ctxt->vstateNr = 1;
	CONT = cont;
	NODE = repl;
	DEPTH = 0;
	OCCURS = 0;
	STATE = 0;
	ret = xmlValidateElementType(ctxt);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((warn) && ((ret != 1) && (ret != -3))) {
	if (ctxt != NULL) {
	    char expr[5000];
	    char list[5000];

	    expr[0] = 0;
	    xmlSnprintfElementContent(&expr[0], 5000, cont, 1);
	    list[0] = 0;
#ifndef LIBXML_REGEXP_ENABLED
	    if (repl != NULL)
		xmlSnprintfElements(&list[0], 5000, repl, 1);
	    else
#endif /* LIBXML_REGEXP_ENABLED */
		xmlSnprintfElements(&list[0], 5000, child, 1);

	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element %s content does not follow the DTD, expecting %s, got %s\n",
		       name, BAD_CAST expr, BAD_CAST list);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element content does not follow the DTD, expecting %s, got %s\n",
		       BAD_CAST expr, BAD_CAST list, NULL);
	    }
	} else {
	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element %s content does not follow the DTD\n",
		       name, NULL, NULL);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element content does not follow the DTD\n",
		                NULL, NULL, NULL);
	    }
	}
	ret = 0;
    }
    if (ret == -3)
	ret = 1;

#ifndef  LIBXML_REGEXP_ENABLED
done:
    /*
     * Deallocate the copy if done, and free up the validation stack
     */
    while (repl != NULL) {
	tmp = repl->next;
	xmlFree(repl);
	repl = tmp;
    }
    ctxt->vstateMax = 0;
    if (ctxt->vstateTab != NULL) {
	xmlFree(ctxt->vstateTab);
	ctxt->vstateTab = NULL;
    }
#endif
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);

}